

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.hpp
# Opt level: O0

Cast * __thiscall verilogAST::Cast::clone_impl(Cast *this)

{
  uint width;
  Cast *this_00;
  pointer __fn;
  int in_ECX;
  void *__child_stack;
  void *in_R8;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_18;
  Cast *local_10;
  Cast *this_local;
  
  local_10 = this;
  this_00 = (Cast *)operator_new(0x18);
  width = this->width;
  __fn = std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
         operator->(&this->expr);
  Expression::clone((Expression *)&local_18,(__fn *)__fn,__child_stack,in_ECX,in_R8);
  Cast(this_00,width,&local_18);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (&local_18);
  return this_00;
}

Assistant:

virtual Cast* clone_impl() const override {
    return new Cast(this->width, this->expr->clone());
  }